

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

SmallBuffer * getBuffer(HelicsDataBuffer data)

{
  Message *pMVar1;
  SmallBuffer *ptr;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar1 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar1->data;
    if (pMVar1 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  return (SmallBuffer *)data;
}

Assistant:

helics::SmallBuffer* getBuffer(HelicsDataBuffer data)
{
    auto* ptr = reinterpret_cast<helics::SmallBuffer*>(data);
    if (ptr != nullptr && ptr->userKey == gBufferValidationIdentifier) {
        return ptr;
    }
    auto* message = getMessageObj(data, nullptr);
    if (message != nullptr) {
        return &message->data;
    }
    return nullptr;
}